

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckColor(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLfloat (*paaGVar2) [3] [4];
  MessageBuilder *pMVar3;
  GLfloat (*paGVar4) [4];
  GLfloat (*paGVar5) [4];
  long lVar6;
  long lVar7;
  GLfloat (*paGVar8) [4];
  ulong uVar9;
  float fVar10;
  float fVar11;
  GLfloat color [2] [3] [4];
  undefined1 local_1a0 [384];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  paGVar8 = color[0];
  color[1][2][0] = 0.0;
  color[1][2][1] = 0.0;
  color[1][2][2] = 0.0;
  color[1][2][3] = 0.0;
  color[1][1][0] = 0.0;
  color[1][1][1] = 0.0;
  color[1][1][2] = 0.0;
  color[1][1][3] = 0.0;
  color[1][0][0] = 0.0;
  color[1][0][1] = 0.0;
  color[1][0][2] = 0.0;
  color[1][0][3] = 0.0;
  color[0][2][0] = 0.0;
  color[0][2][1] = 0.0;
  color[0][2][2] = 0.0;
  color[0][2][3] = 0.0;
  color[0][1][0] = 0.0;
  color[0][1][1] = 0.0;
  color[0][1][2] = 0.0;
  color[0][1][3] = 0.0;
  color[0][0][0] = 0.0;
  color[0][0][1] = 0.0;
  color[0][0][2] = 0.0;
  color[0][0][3] = 0.0;
  uVar9 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1908,0x1406,paGVar8);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xb5b);
  paaGVar2 = CheckColor::reference;
  this_00 = (ostringstream *)(local_1a0 + 8);
  do {
    if (uVar9 == 2) {
LAB_00b0435a:
      return 1 < uVar9;
    }
    lVar6 = 0;
    paGVar4 = paGVar8;
    paGVar5 = *paaGVar2;
    for (; lVar6 != 3; lVar6 = lVar6 + 1) {
      lVar7 = 0;
      while (lVar7 != 4) {
        fVar10 = (*(GLfloat (*) [4])*paGVar5)[lVar7] - (*(GLfloat (*) [4])*paGVar4)[lVar7];
        fVar11 = -fVar10;
        if (-fVar10 <= fVar10) {
          fVar11 = fVar10;
        }
        lVar7 = lVar7 + 1;
        if (0.015625 < fVar11) {
          local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream(this_00);
          std::operator<<((ostream *)this_00,"Blitted framebuffer color buffer contains [[");
          std::ostream::operator<<(this_00,color[0][0][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][0][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][0][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][0][3]);
          std::operator<<((ostream *)this_00,"], [");
          std::ostream::operator<<(this_00,color[0][1][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][1][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][1][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][1][3]);
          std::operator<<((ostream *)this_00,"], [");
          std::ostream::operator<<(this_00,color[0][2][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][2][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][2][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[0][2][3]);
          std::operator<<((ostream *)this_00,"],\n[");
          std::ostream::operator<<(this_00,color[1][0][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][0][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][0][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][0][3]);
          std::operator<<((ostream *)this_00,"], [");
          std::ostream::operator<<(this_00,color[1][1][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][1][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][1][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][1][3]);
          std::operator<<((ostream *)this_00,"], [");
          std::ostream::operator<<(this_00,color[1][2][0]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][2][1]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][2][2]);
          std::operator<<((ostream *)this_00,", ");
          std::ostream::operator<<(this_00,color[1][2][3]);
          std::operator<<((ostream *)this_00,"]], but\n");
          pMVar3 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1a0,(float *)CheckColor::reference);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][0] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], ["
                         );
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1]);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][1] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], ["
                         );
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2]);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[0][2] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "],\n[");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(float *)(CheckColor::reference + 1));
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][0] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], ["
                         );
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1]);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][1] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"], ["
                         );
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2]);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 1);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 2);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
          pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,CheckColor::reference[1][2] + 3);
          std::operator<<(&(pMVar3->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                          "]] was expected.\n");
          tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(this_00);
          goto LAB_00b0435a;
        }
      }
      paGVar5 = paGVar5 + 1;
      paGVar4 = paGVar4 + 1;
    }
    uVar9 = uVar9 + 1;
    paaGVar2 = (GLfloat (*) [3] [4])((long)paaGVar2 + 0x30);
    paGVar8 = paGVar8 + 3;
  } while( true );
}

Assistant:

bool BlitTest::CheckColor()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLfloat reference[2][3][4] = {
		{ { 1.f, 0.f, 0.f, 1.f }, { 0.f, 1.f, 0.f, 1.f }, { 0.f, 0.f, 1.f, 1.f } },
		{ { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f }, { 1.f, 1.f, 0.f, 1.f } }
	};

	/* Copy buffer. */
	glw::GLfloat color[2][3][4] = { { { 0 } } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_RGBA, GL_FLOAT, color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			for (glw::GLuint k = 0; k < 4; ++k)
			{
				if (de::abs(reference[j][i][k] - color[j][i][k]) > (1.f / 64.f) /* Precision. */)
				{
					/* Log. */
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Blitted framebuffer color buffer contains [[" << color[0][0][0]
						<< ", " << color[0][0][1] << ", " << color[0][0][2] << ", " << color[0][0][3] << "], ["
						<< color[0][1][0] << ", " << color[0][1][1] << ", " << color[0][1][2] << ", " << color[0][1][3]
						<< "], [" << color[0][2][0] << ", " << color[0][2][1] << ", " << color[0][2][2] << ", "
						<< color[0][2][3] << "],\n[" << color[1][0][0] << ", " << color[1][0][1] << ", "
						<< color[1][0][2] << ", " << color[1][0][3] << "], [" << color[1][1][0] << ", "
						<< color[1][1][1] << ", " << color[1][1][2] << ", " << color[1][1][3] << "], ["
						<< color[1][2][0] << ", " << color[1][2][1] << ", " << color[1][2][2] << ", " << color[1][2][3]
						<< "]], but\n"
						<< reference[0][0][0] << ", " << reference[0][0][1] << ", " << reference[0][0][2] << ", "
						<< reference[0][0][3] << "], [" << reference[0][1][0] << ", " << reference[0][1][1] << ", "
						<< reference[0][1][2] << ", " << reference[0][1][3] << "], [" << reference[0][2][0] << ", "
						<< reference[0][2][1] << ", " << reference[0][2][2] << ", " << reference[0][2][3] << "],\n["
						<< reference[1][0][0] << ", " << reference[1][0][1] << ", " << reference[1][0][2] << ", "
						<< reference[1][0][3] << "], [" << reference[1][1][0] << ", " << reference[1][1][1] << ", "
						<< reference[1][1][2] << ", " << reference[1][1][3] << "], [" << reference[1][2][0] << ", "
						<< reference[1][2][1] << ", " << reference[1][2][2] << ", " << reference[1][2][3]
						<< "]] was expected.\n"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}
	}

	return true;
}